

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cc
# Opt level: O3

size_t webrtc::WriteInt16BufferToFile(FileWrapper *file,size_t length,int16_t *buffer)

{
  int iVar1;
  int16_t *piVar2;
  size_t sVar3;
  
  if (file == (FileWrapper *)0x0) {
    sVar3 = 0;
  }
  else {
    iVar1 = (*(file->super_InStream)._vptr_InStream[4])();
    sVar3 = 0;
    if (((length != 0) && (buffer != (int16_t *)0x0)) && ((char)iVar1 != '\0')) {
      piVar2 = (int16_t *)operator_new__(2);
      sVar3 = 0;
      do {
        *piVar2 = buffer[sVar3];
        (**(file->super_OutStream)._vptr_OutStream)(&file->super_OutStream,piVar2,2);
        sVar3 = sVar3 + 1;
      } while (length != sVar3);
      (*(file->super_InStream)._vptr_InStream[9])(file);
      operator_delete__(piVar2);
      sVar3 = length;
    }
  }
  return sVar3;
}

Assistant:

size_t WriteInt16BufferToFile(FileWrapper* file,
                              size_t length,
                              const int16_t* buffer) {
  if (!file || !file->Open() || !buffer || length <= 0) {
    return 0;
  }

  std::unique_ptr<uint8_t[]> byte_array(new uint8_t[2]);

  size_t int16s_written = 0;

  for (int16s_written = 0; int16s_written < length; ++int16s_written) {
    // Get byte representation.
    byte_array[0] = buffer[int16s_written] & 0xFF;
    byte_array[1] = (buffer[int16s_written] >> 8) & 0xFF;

    file->Write(byte_array.get(), 2);
  }

  file->Flush();

  return int16s_written;
}